

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_buffer_send(dynbuf *in,connectdata *conn,curl_off_t *bytes_written,
                         size_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  void *pvVar1;
  void *pvVar2;
  ssize_t sVar3;
  dynbuf *pdVar4;
  CURLcode CVar5;
  size_t sVar6;
  char *pcVar7;
  ulong size;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  char *local_60;
  ssize_t amount;
  dynbuf *local_48;
  void *local_40;
  long *local_38;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  sockfd = conn->sock[socketindex];
  local_38 = bytes_written;
  local_60 = Curl_dyn_ptr(in);
  sVar6 = Curl_dyn_len(in);
  sVar9 = sVar6;
  if ((((conn->handler->flags & 1) != 0) || ((conn->http_proxy).proxytype == CURLPROXY_HTTPS)) &&
     (conn->httpversion != 0x14)) {
    CVar5 = Curl_get_upload_buffer(data);
    if (CVar5 != CURLE_OK) goto LAB_0012479c;
    sVar9 = 0x4000;
    if (sVar6 < 0x4000) {
      sVar9 = sVar6;
    }
    memcpy((data->state).ulbuf,local_60,sVar9);
    local_60 = (data->state).ulbuf;
  }
  CVar5 = Curl_write(conn,sockfd,local_60,sVar9,&amount);
  sVar3 = amount;
  if (CVar5 == CURLE_OK) {
    uVar8 = sVar6 - included_body_bytes;
    size = uVar8;
    if ((ulong)amount < uVar8) {
      size = amount;
    }
    sVar10 = amount - size;
    local_48 = in;
    local_40 = pvVar1;
    if ((((data->set).field_0x97b & 0x40) != 0) &&
       (Curl_debug(data,CURLINFO_HEADER_OUT,local_60,size), uVar8 < (ulong)sVar3)) {
      Curl_debug(data,CURLINFO_DATA_OUT,local_60 + size,sVar10);
    }
    pvVar1 = local_40;
    *local_38 = *local_38 + amount;
    if (local_40 == (void *)0x0) {
      in = local_48;
      if (amount != sVar6) {
        return CURLE_SEND_ERROR;
      }
    }
    else {
      lVar11 = sVar10 + (data->req).writebytecount;
      (data->req).writebytecount = lVar11;
      Curl_pgrsSetUploadCounter(data,lVar11);
      pdVar4 = local_48;
      lVar11 = sVar6 - amount;
      if (lVar11 != 0) {
        pcVar7 = Curl_dyn_ptr(local_48);
        pvVar2 = (data->state).in;
        *(curl_read_callback *)((long)pvVar1 + 0x1f0) = (data->state).fread_func;
        *(void **)((long)pvVar1 + 0x1f8) = pvVar2;
        *(undefined8 *)((long)pvVar1 + 0x200) = *(undefined8 *)((long)pvVar1 + 0x10);
        *(undefined8 *)((long)pvVar1 + 0x208) = *(undefined8 *)((long)pvVar1 + 8);
        (data->state).fread_func = readmoredata;
        (data->state).in = conn;
        *(char **)((long)pvVar1 + 0x10) = pcVar7 + amount;
        *(long *)((long)pvVar1 + 8) = lVar11;
        pcVar7 = pdVar4->bufr;
        sVar6 = pdVar4->leng;
        sVar10 = pdVar4->toobig;
        *(size_t *)((long)pvVar1 + 0x228) = pdVar4->allc;
        *(size_t *)((long)pvVar1 + 0x230) = sVar10;
        *(char **)((long)pvVar1 + 0x218) = pcVar7;
        *(size_t *)((long)pvVar1 + 0x220) = sVar6;
        *(undefined4 *)((long)pvVar1 + 0x210) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)((long)pvVar1 + 0x210) = 2;
      in = local_48;
    }
  }
LAB_0012479c:
  Curl_dyn_free(in);
  return CVar5;
}

Assistant:

CURLcode Curl_buffer_send(struct dynbuf *in,
                          struct connectdata *conn,
                          /* add the number of sent bytes to this
                             counter */
                          curl_off_t *bytes_written,
                          /* how much of the buffer contains body data */
                          size_t included_body_bytes,
                          int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = Curl_dyn_ptr(in);
  size = Curl_dyn_len(in);

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_dyn_free(in);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL
#ifndef CURL_DISABLE_PROXY
      || conn->http_proxy.proxytype == CURLPROXY_HTTPS
#endif
       )
     && conn->httpversion != 20) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize = CURLMIN(size, CURL_MAX_WRITE_SIZE);

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_dyn_free(in);
      return result;
    }
    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else {
#ifdef CURLDEBUG
    /* Allow debug builds override this logic to force short initial sends */
    char *p = getenv("CURL_SMALLREQSEND");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        sendsize = CURLMIN(size, altsize);
      else
        sendsize = size;
    }
    else
#endif
    sendsize = size;
  }

  result = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    if(data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(data, CURLINFO_DATA_OUT,
                   ptr + headlen, bodylen);
      }
    }

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = Curl_dyn_ptr(in) + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = *in; /* copy the whole struct */
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_dyn_free(in);

  return result;
}